

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

bool __thiscall
pstore::file::file_handle::lock
          (file_handle *this,uint64_t offset,size_t size,lock_kind kind,blocking_mode block)

{
  int iVar1;
  int *piVar2;
  undefined1 local_58 [44];
  int err;
  bool got_lock;
  blocking_mode bStack_28;
  short type;
  int cmd;
  blocking_mode block_local;
  lock_kind kind_local;
  size_t size_local;
  uint64_t offset_local;
  file_handle *this_local;
  
  bStack_28 = block;
  cmd = kind;
  _block_local = size;
  size_local = offset;
  offset_local = (uint64_t)this;
  if ((0x7fffffffffffffff < offset) || (0x7fffffffffffffff < size)) {
    raise<std::errc,char[5]>(invalid_argument,(char (*) [5])"lock");
  }
  ensure_open(this);
  err = 0;
  if (bStack_28 == non_blocking) {
    err = 6;
  }
  else if (bStack_28 == blocking) {
    err = 7;
  }
  local_58._42_2_ = 0;
  if (cmd == 0) {
    local_58._42_2_ = 0;
  }
  else if (cmd == 1) {
    local_58._42_2_ = 1;
  }
  local_58[0x29] = 1;
  iVar1 = lock_reg(this->file_,err,local_58._42_2_,size_local,0,_block_local);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if ((bStack_28 != non_blocking) || ((iVar1 != 0xd && (iVar1 != 0xb)))) {
      local_58._36_4_ = iVar1;
      path_abi_cxx11_((file_handle *)local_58);
      (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
                (iVar1,"fcntl/lock failed",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    }
    local_58[0x29] = 0;
  }
  return (bool)(local_58[0x29] & 1);
}

Assistant:

bool file_handle::lock (std::uint64_t const offset, std::size_t const size,
                                lock_kind const kind, blocking_mode const block) {
            if (offset > uoff_max || size > uoff_max) {
                raise (std::errc::invalid_argument, "lock");
            }
            this->ensure_open ();

            int cmd = 0;
            switch (block) {
            case blocking_mode::non_blocking: cmd = F_SETLK; break;
            case blocking_mode::blocking: cmd = F_SETLKW; break;
            }

            short type = 0;
            switch (kind) {
            case lock_kind::shared_read: type = F_RDLCK; break;
            case lock_kind::exclusive_write: type = F_WRLCK; break;
            }

            bool got_lock = true;
            if (file_handle::lock_reg (file_,
                                       cmd, // set a file lock (maybe a blocking one),
                                       type, static_cast<off_t> (offset), SEEK_SET,
                                       static_cast<off_t> (size)) != 0) {
                int const err = errno;
                if (block == blocking_mode::non_blocking && (err == EACCES || err == EAGAIN)) {
                    // The cmd argument is F_SETLK; the type of lock (l_type) is a shared (F_RDLCK)
                    // or exclusive (F_WRLCK) lock and the segment of a file to be locked is already
                    // exclusive-locked by another process, or the type is an exclusive lock and
                    // some portion of the segment of a file to be locked is already shared-locked
                    // or exclusive-locked by another process
                    got_lock = false;
                } else {
                    raise_file_error (err, "fcntl/lock failed", this->path ());
                }
            }
            return got_lock;
        }